

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_EmbeddedFile::Write(ON_EmbeddedFile *this,ON_BinaryArchive *archive)

{
  CImpl *s;
  bool bVar1;
  
  s = this->m_impl;
  if ((s->m_data).m_error == false) {
    bVar1 = ON_BinaryArchive::WriteString(archive,&s->m_orig_file);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteCompressedBuffer
                        (archive,(s->m_data).m_length,
                         (s->m_data).m_buffer._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_EmbeddedFile::Write(ON_BinaryArchive& archive) const
{
  auto& d = m_impl->m_data;
  if (d.m_error)
    return false; // Can't write when in error state.

  // Write the original filename to the archive.
  if (!archive.WriteString(m_impl->m_orig_file))
    return false;

  // Write the temp file data to the archive.
  if (!archive.WriteCompressedBuffer(d.m_length, d.m_buffer.get()))
    return false;

  return true;
}